

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_extpdp_mipsel
          (target_ulong_conflict ac,target_ulong_conflict size,CPUMIPSState_conflict4 *env)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t pos;
  uint64_t uVar3;
  uint64_t acc;
  uint32_t temp;
  int sub;
  int32_t start_pos;
  CPUMIPSState_conflict4 *env_local;
  target_ulong_conflict size_local;
  target_ulong_conflict ac_local;
  
  uVar1 = size & 0x1f;
  acc._4_4_ = 0;
  uVar2 = get_DSPControl_pos(env);
  pos = uVar2 - (uVar1 + 1);
  if ((int)pos < -1) {
    set_DSPControl_efi(1,env);
  }
  else {
    uVar3 = extract64(CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]),uVar2 - uVar1,
                      uVar1 + 1);
    acc._4_4_ = (target_ulong_conflict)uVar3;
    set_DSPControl_pos(pos,env);
    set_DSPControl_efi(0,env);
  }
  return acc._4_4_;
}

Assistant:

target_ulong helper_extpdp(target_ulong ac, target_ulong size,
                           CPUMIPSState *env)
{
    int32_t start_pos;
    int sub;
    uint32_t temp;
    uint64_t acc;

    size = size & 0x1F;
    temp = 0;
    start_pos = get_DSPControl_pos(env);
    sub = start_pos - (size + 1);
    if (sub >= -1) {
        acc  = ((uint64_t)env->active_tc.HI[ac] << 32) |
               ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);
        temp = extract64(acc, start_pos - size, size + 1);

        set_DSPControl_pos(sub, env);
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return (target_ulong)temp;
}